

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O0

void accum_global_mixw(model_inventory_t *inv,gauden_t *g)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32 *puVar5;
  float32 ***pppfVar6;
  float32 ***pppfVar7;
  uint local_50;
  uint local_4c;
  uint32 k;
  uint32 j;
  uint32 ii;
  uint32 i;
  float32 ***l_mixw_acc;
  float32 ***mixw_acc;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_local;
  uint32 *global_mixw;
  gauden_t *g_local;
  model_inventory_t *inv_local;
  
  puVar5 = inv->mixw_inverse;
  uVar1 = inv->n_mixw_inverse;
  uVar2 = g->n_feat;
  uVar3 = g->n_density;
  pppfVar6 = inv->mixw_acc;
  pppfVar7 = inv->l_mixw_acc;
  for (k = 0; k < uVar1; k = k + 1) {
    uVar4 = puVar5[k];
    for (local_4c = 0; local_4c < uVar2; local_4c = local_4c + 1) {
      for (local_50 = 0; local_50 < uVar3; local_50 = local_50 + 1) {
        pppfVar6[uVar4][local_4c][local_50] =
             (float32)((float)pppfVar7[k][local_4c][local_50] +
                      (float)pppfVar6[uVar4][local_4c][local_50]);
      }
    }
  }
  return;
}

Assistant:

void
accum_global_mixw(model_inventory_t *inv, gauden_t *g)
{
    uint32 *global_mixw;	/* a mapping from local mixing weight id to global one */
    uint32 n_local;		/* # of local mixing weights */
    uint32 n_feat;		/* # of independent feature streams */
    uint32 n_density;		/* # of densities per mixture density */
    float32 ***mixw_acc;	/* global mixing weight accumulators */
    float32 ***l_mixw_acc;	/* local mixing weight accumulators */
    uint32 i, ii, j, k;		/* iterators and temporary variables */

    global_mixw = inv->mixw_inverse;
    n_local = inv->n_mixw_inverse;
    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);

    mixw_acc = inv->mixw_acc;
    l_mixw_acc = inv->l_mixw_acc;

    for (ii = 0; ii < n_local; ii++) {
	i = global_mixw[ii];
	    
	for (j = 0; j < n_feat; j++) {
	    for (k = 0; k < n_density; k++) {
		mixw_acc[i][j][k] += l_mixw_acc[ii][j][k];
	    }
	}
    }
}